

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridges_articulations.cpp
# Opt level: O0

int count_rec(int v,int skip)

{
  bool bVar1;
  int iVar2;
  reference this;
  reference piVar3;
  bool local_59;
  reference local_58;
  int local_44;
  iterator iStack_40;
  int to;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  int local_14;
  int local_10;
  int cnt;
  int skip_local;
  int v_local;
  
  local_14 = 1;
  local_10 = skip;
  cnt = v;
  ___range1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::usedcnt,
                         (long)v);
  std::_Bit_reference::operator=((_Bit_reference *)&__range1,true);
  this = std::
         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ::operator[](&edge,(long)cnt);
  __end1 = std::vector<int,_std::allocator<int>_>::begin(this);
  iStack_40 = std::vector<int,_std::allocator<int>_>::end(this);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc0), bVar1) {
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    local_44 = *piVar3;
    local_59 = true;
    if (local_44 != local_10) {
      local_58 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::usedcnt,
                            (long)local_44);
      local_59 = std::_Bit_reference::operator_cast_to_bool(&local_58);
    }
    if (local_59 == false) {
      iVar2 = count_rec(local_44,local_10);
      local_14 = iVar2 + local_14;
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  return local_14;
}

Assistant:

int count_rec(int v, int skip) {
    int cnt = 1;
    usedcnt[v] = true;

    for (int to : edge[v]) {
        if(to == skip || usedcnt[to]) 
            continue;

        cnt += count_rec(to, skip);
    }
    
    return cnt;
}